

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp_queue.c
# Opt level: O2

csp_packet_t * csp_rdp_queue_get(csp_queue_handle_t queue,csp_conn_t *conn)

{
  int iVar1;
  int iVar2;
  csp_packet_t *in_RAX;
  bool bVar3;
  csp_packet_t *packet;
  csp_packet_t *local_28;
  
  local_28 = in_RAX;
  iVar1 = csp_queue_size(queue);
  while ((bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3 &&
         (iVar2 = csp_queue_dequeue(queue,&local_28,0), iVar2 == 0))) {
    if ((local_28->field_0).field_0.conn == conn) {
      return local_28;
    }
    csp_rdp_queue_add(queue,conn,local_28);
  }
  return (csp_packet_t *)0x0;
}

Assistant:

static csp_packet_t * csp_rdp_queue_get(csp_queue_handle_t queue, csp_conn_t * conn) {
    csp_packet_t * packet;
    int size = csp_queue_size(queue);

    while(size--) {
        if (csp_queue_dequeue(queue, &packet, 0) != CSP_QUEUE_OK) {
            /* Error */
            return NULL;
        }

        if (packet->conn == conn) {
            /* Found it */
            return packet;
        }

        /* Put it back and check next */
        csp_rdp_queue_add(queue, conn, packet);
    }

    return NULL;
}